

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

QPainterPath
anon_unknown.dwarf_d603ce::clip<((anonymous_namespace)::Edge)3>(QPainterPath *path,qreal t)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QPointF *in_RSI;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal in_XMM0_Qa;
  int last;
  Element *element;
  int i;
  QPainterPath *result;
  undefined4 in_stack_fffffffffffffe08;
  QExplicitlySharedDataPointer<QPainterPathPrivate> this;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int iVar4;
  uint3 in_stack_fffffffffffffe34;
  uint uVar5;
  QPainterPathPrivate *a;
  QPainterPath *in_stack_fffffffffffffe50;
  qreal in_stack_fffffffffffffe58;
  QPointF *in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe68 [16];
  QPointF *in_stack_fffffffffffffe78;
  Element local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_fffffffffffffe34;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this.d.ptr = (totally_ordered_wrapper<QPainterPathPrivate_*>)
               (totally_ordered_wrapper<QPainterPathPrivate_*>)in_RDI;
  a = in_RDI;
  QPainterPath::QPainterPath((QPainterPath *)0x5d7dc9);
  iVar4 = 1;
  while (iVar3 = iVar4, iVar2 = QPainterPath::elementCount((QPainterPath *)in_RDI), iVar4 < iVar2) {
    QPainterPath::elementAt
              ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (int)((ulong)this.d.ptr >> 0x20));
    bVar1 = QPainterPath::Element::isLineTo(&local_20);
    iVar4 = (int)((ulong)this.d.ptr >> 0x20);
    if (bVar1) {
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),iVar4
                );
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)this.d.ptr >> 0x20));
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      clipLine<((anonymous_namespace)::Edge)3>
                ((QPointF *)a,in_RSI,in_XMM0_Qa,(QPainterPath *)CONCAT44(uVar5,iVar3));
    }
    else {
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),iVar4
                );
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)this.d.ptr >> 0x20));
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)this.d.ptr >> 0x20));
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      QPainterPath::elementAt
                ((QPainterPath *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)this.d.ptr >> 0x20));
      QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
      clipBezier<((anonymous_namespace)::Edge)3>
                (in_stack_fffffffffffffe78,in_stack_fffffffffffffe68._8_8_,
                 in_stack_fffffffffffffe68._0_8_,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                 ,in_stack_fffffffffffffe50);
      iVar3 = iVar3 + 2;
    }
    iVar4 = iVar3 + 1;
  }
  iVar2 = QPainterPath::elementCount((QPainterPath *)in_RDI);
  iVar2 = iVar2 + -1;
  QPainterPath::elementAt
            ((QPainterPath *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
             (int)((ulong)this.d.ptr >> 0x20));
  QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
  QPainterPath::elementAt
            ((QPainterPath *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
             (int)((ulong)this.d.ptr >> 0x20));
  QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
  bVar1 = ::operator!=((QPointF *)in_RDI,(QPointF *)CONCAT44(iVar4,in_stack_fffffffffffffe08));
  if (bVar1) {
    QPainterPath::elementAt
              ((QPainterPath *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
               (int)((ulong)this.d.ptr >> 0x20));
    QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
    QPainterPath::elementAt
              ((QPainterPath *)CONCAT44(iVar2,in_stack_fffffffffffffe20),
               (int)((ulong)this.d.ptr >> 0x20));
    QPainterPath::Element::operator_cast_to_QPointF((Element *)this.d.ptr);
    clipLine<((anonymous_namespace)::Edge)3>
              ((QPointF *)a,in_RSI,in_XMM0_Qa,(QPainterPath *)CONCAT44(uVar5,iVar3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)this.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath clip(const QPainterPath &path, qreal t)
{
    QPainterPath result;
    for (int i = 1; i < path.elementCount(); ++i) {
        const QPainterPath::Element &element = path.elementAt(i);
        Q_ASSERT(!element.isMoveTo());
        if (element.isLineTo()) {
            clipLine<edge>(path.elementAt(i-1), path.elementAt(i), t, result);
        } else {
            clipBezier<edge>(path.elementAt(i-1), path.elementAt(i), path.elementAt(i+1), path.elementAt(i+2), t, result);
            i += 2;
        }
    }

    int last = path.elementCount() - 1;
    if (QPointF(path.elementAt(last)) != QPointF(path.elementAt(0)))
        clipLine<edge>(path.elementAt(last), path.elementAt(0), t, result);

    return result;
}